

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_avx2.c
# Opt level: O0

void highbd_load_b_values_avx2(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [16];
  undefined1 (*in_R8) [16];
  undefined1 (*in_R9) [32];
  undefined1 auVar4 [16];
  undefined1 (*in_stack_00000008) [16];
  undefined1 (*in_stack_00000010) [32];
  undefined1 (*in_stack_00000018) [16];
  undefined1 (*in_stack_00000020) [32];
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar3 = vpmovsxwd_avx2(*in_RDI);
  *in_RSI = auVar3;
  auVar1 = vpinsrd_avx(ZEXT416(1),1,1);
  auVar1 = vpinsrd_avx(auVar1,1,2);
  auVar1 = vpinsrd_avx(auVar1,1,3);
  auVar2 = vpinsrd_avx(ZEXT416(1),1,1);
  auVar2 = vpinsrd_avx(auVar2,1,2);
  auVar2 = vpinsrd_avx(auVar2,1,3);
  auVar4 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  uStack_70 = auVar4._0_8_;
  uStack_68 = auVar4._8_8_;
  auVar3._16_8_ = uStack_70;
  auVar3._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar3._24_8_ = uStack_68;
  auVar3 = vpsubd_avx2(*in_RSI,auVar3);
  *in_RSI = auVar3;
  auVar3 = vpmovsxwd_avx2(*in_RDX);
  *in_RCX = auVar3;
  auVar3 = vpmovsxwd_avx2(*in_R8);
  *in_R9 = auVar3;
  auVar3 = vpmovsxwd_avx2(*in_stack_00000008);
  *in_stack_00000010 = auVar3;
  auVar3 = vpmovsxwd_avx2(*in_stack_00000018);
  *in_stack_00000020 = auVar3;
  return;
}

Assistant:

static inline void highbd_load_b_values_avx2(
    const int16_t *zbin_ptr, __m256i *zbin, const int16_t *round_ptr,
    __m256i *round, const int16_t *quant_ptr, __m256i *quant,
    const int16_t *dequant_ptr, __m256i *dequant, const int16_t *shift_ptr,
    __m256i *shift) {
  *zbin = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)zbin_ptr));
  *zbin = _mm256_sub_epi32(*zbin, _mm256_set1_epi32(1));
  *round = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)round_ptr));
  *quant = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)quant_ptr));
  *dequant =
      _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)dequant_ptr));
  *shift = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)shift_ptr));
}